

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_add_mhmarker_v2(opj_codestream_index_t *cstr_index,OPJ_UINT32 type,OPJ_OFF_T pos,
                        OPJ_UINT32 len)

{
  uint uVar1;
  opj_marker_info_t *poVar2;
  
  if (cstr_index->maxmarknum < cstr_index->marknum + 1) {
    uVar1 = (int)(float)cstr_index->maxmarknum + 100;
    cstr_index->maxmarknum = uVar1;
    poVar2 = (opj_marker_info_t *)realloc(cstr_index->marker,(ulong)uVar1 * 0x18);
    cstr_index->marker = poVar2;
  }
  poVar2 = cstr_index->marker;
  uVar1 = cstr_index->marknum;
  poVar2[uVar1].type = (unsigned_short)type;
  poVar2[uVar1].pos = (long)(int)pos;
  poVar2[uVar1].len = len;
  cstr_index->marknum = uVar1 + 1;
  return;
}

Assistant:

static void j2k_add_mhmarker_v2(opj_codestream_index_t *cstr_index, OPJ_UINT32 type, OPJ_OFF_T pos, OPJ_UINT32 len)
{
	assert(cstr_index != 00);

	/* expand the list? */
	if ((cstr_index->marknum + 1) > cstr_index->maxmarknum) {
		cstr_index->maxmarknum = 100 + (int) ((float) cstr_index->maxmarknum * 1.0F);
		cstr_index->marker = (opj_marker_info_t*)opj_realloc(cstr_index->marker, cstr_index->maxmarknum *sizeof(opj_marker_info_t));
	}

	/* add the marker */
	cstr_index->marker[cstr_index->marknum].type = (OPJ_UINT16)type;
	cstr_index->marker[cstr_index->marknum].pos = (OPJ_INT32)pos;
	cstr_index->marker[cstr_index->marknum].len = (OPJ_INT32)len;
	cstr_index->marknum++;

}